

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

extent_t *
extent_alloc_wrapper
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,void *new_addr,size_t size,
          size_t pad,size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  byte *pbVar3;
  _Bool _Var4;
  long lVar5;
  extent_hooks_t **ppeVar6;
  _Bool _Var7;
  int iVar8;
  extent_split_interior_result_t eVar9;
  extent_hooks_t *peVar10;
  extent_t *peVar11;
  void *pvVar12;
  size_t sVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 uVar20;
  uint uVar21;
  _Bool *p_Var22;
  extent_t **lead_00;
  int iVar23;
  byte bVar24;
  rtree_ctx_t *prVar25;
  extents_t *extents;
  size_t sVar26;
  tsd_t *tsd;
  bool bVar27;
  szind_t in_stack_fffffffffffffc68;
  _Bool committed;
  _Bool zeroed;
  extent_t *extent;
  size_t local_378;
  extent_hooks_t **local_370;
  void *local_368;
  extent_t *local_360;
  ulong local_358;
  extent_t *to_salvage;
  extent_t *to_leak;
  extent_t *trail;
  extent_t *lead;
  rtree_ctx_t local_330;
  rtree_ctx_t rtree_ctx_fallback;
  
  local_368 = new_addr;
  if (*r_extent_hooks == (extent_hooks_t *)0x0) {
    peVar10 = base_extent_hooks_get(arena->base);
    *r_extent_hooks = peVar10;
  }
  __mutex = (pthread_mutex_t *)((long)&(arena->extent_grow_mtx).field_0 + 0x40);
  iVar8 = pthread_mutex_trylock(__mutex);
  if (iVar8 != 0) {
    malloc_mutex_lock_slow(&arena->extent_grow_mtx);
    (arena->extent_grow_mtx).field_0.field_0.locked.repr = true;
  }
  pvVar12 = local_368;
  puVar1 = &(arena->extent_grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((arena->extent_grow_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->extent_grow_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(arena->extent_grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  extents = &arena->extents_retained;
  local_358 = (ulong)slab;
  local_378 = pad;
  local_370 = r_extent_hooks;
  peVar11 = extent_recycle(tsdn,arena,r_extent_hooks,extents,local_368,size,pad,alignment,slab,szind
                           ,zero,commit,SUB41(in_stack_fffffffffffffc68,0));
  ppeVar6 = local_370;
  if (peVar11 == (extent_t *)0x0) {
    if ((pvVar12 == (void *)0x0) && (opt_retain != false)) {
      uVar18 = ((size + local_378) - 0x1000) + (alignment + 0xfff & 0xfffffffffffff000);
      if (size + local_378 <= uVar18) {
        uVar21 = arena->extent_grow_next;
        iVar8 = 1;
        do {
          uVar17 = sz_pind2sz_tab[uVar21];
          if (uVar18 <= uVar17) {
            extent = extent_alloc(tsdn,arena);
            if (extent == (extent_t *)0x0) break;
            zeroed = false;
            committed = false;
            local_360 = extent;
            if (*ppeVar6 == &extent_hooks_default) {
              p_Var22 = &zeroed;
              pvVar12 = extent_alloc_default_impl
                                  (tsdn,arena,(void *)0x0,uVar17,0x1000,p_Var22,&committed);
              uVar20 = SUB81(p_Var22,0);
            }
            else {
              extent_hook_pre_reentrancy(tsdn,arena);
              peVar10 = *ppeVar6;
              p_Var22 = &committed;
              pvVar12 = (*peVar10->alloc)(peVar10,(void *)0x0,uVar17,0x1000,&zeroed,p_Var22,
                                          arena->base->ind);
              uVar20 = SUB81(p_Var22,0);
              extent_hook_post_reentrancy(tsdn);
            }
            sVar26 = arena_extent_sn_next(arena);
            peVar11 = local_360;
            if (arena == (arena_t *)0x0) {
              uVar18 = 0xfff;
            }
            else {
              uVar18 = (ulong)arena->base->ind;
            }
            local_360->e_addr = pvVar12;
            (local_360->field_2).e_size_esn = (uint)(local_360->field_2).e_size_esn & 0xfff | uVar17
            ;
            local_360->e_bits =
                 (sVar26 << 0x2a | local_360->e_bits & 0x3fffc000000 | uVar18 & 0xfffffffffc000fff)
                 + (ulong)((uint)committed << 0xd | (uint)zeroed << 0xf) + 0x3a04000;
            (local_360->ql_link).qre_next = local_360;
            (local_360->ql_link).qre_prev = local_360;
            if (pvVar12 == (void *)0x0) {
              extent_dalloc(tsdn,arena,local_360);
              break;
            }
            _Var7 = extent_register_impl(tsdn,local_360,false);
            ppeVar6 = local_370;
            if (!_Var7) {
              uVar21 = (uint)peVar11->e_bits;
              if ((~uVar21 & 0xa000) == 0) {
                *zero = true;
              }
              if ((uVar21 >> 0xd & 1) != 0) {
                *commit = true;
              }
              if (tsdn == (tsdn_t *)0x0) {
                prVar25 = &rtree_ctx_fallback;
                rtree_ctx_data_init(prVar25);
              }
              else {
                prVar25 = &(tsdn->tsd).
                           cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
              }
              lead_00 = &lead;
              eVar9 = extent_split_interior
                                (tsdn,arena,ppeVar6,prVar25,&extent,lead_00,&trail,&to_leak,
                                 &to_salvage,(void *)size,local_378,alignment,local_358,
                                 SUB41(szind,0),in_stack_fffffffffffffc68,SUB81(extents,0));
              uVar16 = (undefined1)in_stack_fffffffffffffc68;
              uVar20 = SUB81(lead_00,0);
              if (eVar9 == extent_split_interior_ok) {
                if (lead != (extent_t *)0x0) {
                  extent_record(tsdn,arena,ppeVar6,extents,lead,(_Bool)uVar20);
                }
                if (trail != (extent_t *)0x0) {
                  extent_record(tsdn,arena,ppeVar6,extents,trail,(_Bool)uVar20);
                }
                peVar11 = extent;
                if ((*commit == true) && ((extent->e_bits & 0x2000) == 0)) {
                  uVar18 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
                  _Var7 = extent_commit_impl(tsdn,arena,ppeVar6,extent,0,uVar18,(_Bool)uVar16);
                  if (_Var7) {
                    extent_record(tsdn,arena,ppeVar6,extents,peVar11,SUB81(uVar18,0));
                    break;
                  }
                  peVar10 = base_extent_hooks_get(arena->base);
                  if ((peVar10 == &extent_hooks_default) && (opt_thp != thp_mode_always)) {
                    pbVar3 = (byte *)((long)&peVar11->e_bits + 1);
                    *pbVar3 = *pbVar3 | 0x80;
                  }
                }
                uVar21 = iVar8 + arena->extent_grow_next;
                if (arena->retain_grow_limit <= uVar21) {
                  uVar21 = arena->retain_grow_limit;
                }
                arena->extent_grow_next = uVar21;
                (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
                pthread_mutex_unlock(__mutex);
                if (local_378 != 0) {
                  extent_addr_randomize(tsdn,extent,alignment);
                }
                if (slab) {
                  if (tsdn == (tsdn_t *)0x0) {
                    prVar25 = &local_330;
                    rtree_ctx_data_init(prVar25);
                  }
                  else {
                    prVar25 = &(tsdn->tsd).
                               cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
                  }
                  extent->e_bits = extent->e_bits | 0x1000;
                  extent_interior_register(tsdn,prVar25,extent,szind);
                }
                peVar11 = extent;
                if ((*zero == true) && ((extent->e_bits & 0x8000) == 0)) {
                  pvVar12 = (void *)((ulong)extent->e_addr & 0xfffffffffffff000);
                  uVar18 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
                  peVar10 = base_extent_hooks_get(arena->base);
                  if ((peVar10 != &extent_hooks_default) ||
                     ((opt_thp == thp_mode_always ||
                      (_Var7 = pages_purge_forced(pvVar12,uVar18), peVar11 = extent, _Var7)))) {
                    memset(pvVar12,0,uVar18);
                    peVar11 = extent;
                  }
                }
                goto LAB_0012e4b4;
              }
              uVar16 = extraout_DL;
              if (to_salvage != (extent_t *)0x0) {
                extent_record(tsdn,arena,ppeVar6,extents,to_salvage,(_Bool)uVar20);
                uVar16 = extraout_DL_00;
              }
              if (to_leak == (extent_t *)0x0) break;
              extent_deregister_impl(tsdn,to_leak,(_Bool)uVar16);
              peVar11 = to_leak;
            }
            extents_leak(tsdn,arena,ppeVar6,extents,peVar11,(_Bool)uVar20);
            break;
          }
          for (lVar5 = 0x3f; 0xdfffffffffffffffU >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
          uVar15 = (uint)lVar5;
          iVar23 = uVar15 - 0xe;
          if (uVar15 < 0xe) {
            iVar23 = 0;
          }
          bVar24 = (char)lVar5 - 3;
          if (uVar15 < 0xf) {
            bVar24 = 0xc;
          }
          uVar21 = uVar21 + 1;
          iVar8 = iVar8 + 1;
        } while (uVar21 < ((uint)(((0x6fffffffffffffffU >> (bVar24 & 0x3f)) << (bVar24 & 0x3f)) >>
                                 (bVar24 & 0x3f)) & 3) + iVar23 * 4);
      }
      (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      peVar11 = (extent_t *)0x0;
    }
    else {
      (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      peVar11 = (extent_t *)0x0;
    }
  }
  else {
    (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
LAB_0012e4b4:
  ppeVar6 = local_370;
  if (peVar11 == (extent_t *)0x0) {
    if (((local_368 == (void *)0x0) || (opt_retain == false)) &&
       (peVar11 = extent_alloc(tsdn,arena), peVar11 != (extent_t *)0x0)) {
      sVar26 = size + local_378;
      uVar18 = alignment + 0xfff & 0xfffffffffffff000;
      if (*ppeVar6 == &extent_hooks_default) {
        pvVar12 = extent_alloc_default_impl(tsdn,arena,local_368,sVar26,uVar18,zero,commit);
      }
      else {
        extent_hook_pre_reentrancy(tsdn,arena);
        pvVar12 = (*(*ppeVar6)->alloc)
                            (*ppeVar6,local_368,sVar26,uVar18,zero,commit,arena->base->ind);
        extent_hook_post_reentrancy(tsdn);
      }
      if (pvVar12 == (void *)0x0) {
        extent_dalloc(tsdn,arena,peVar11);
      }
      else {
        sVar13 = arena_extent_sn_next(arena);
        _Var7 = *zero;
        _Var4 = *commit;
        if (arena == (arena_t *)0x0) {
          uVar18 = 0xfff;
        }
        else {
          uVar18 = (ulong)arena->base->ind;
        }
        peVar11->e_addr = pvVar12;
        (peVar11->field_2).e_size_esn = (uint)(peVar11->field_2).e_size_esn & 0xfff | sVar26;
        uVar17 = (ulong)_Var7 << 0xf |
                 sVar13 << 0x2a |
                 ((ulong)szind & 0xffffff) << 0x12 | (ulong)(uint)((int)local_358 << 0xc);
        peVar11->e_bits =
             (ulong)_Var4 << 0xd | uVar17 |
             peVar11->e_bits & 0x3fffc000000 | uVar18 & 0xfffffffffc000fff | 0x4000;
        (peVar11->ql_link).qre_next = peVar11;
        (peVar11->ql_link).qre_prev = peVar11;
        if (alignment < 0x1000 && local_378 != 0) {
          uVar21 = (int)alignment + 0x3fU & 0x1fc0;
          alignment = (size_t)uVar21;
          uVar17 = 0x3f;
          if ((void *)alignment != (void *)0x0) {
            for (; uVar21 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          bVar24 = (byte)uVar17;
          if (tsdn == (tsdn_t *)0x0) {
            alignment = (size_t)arenas[(uint)uVar18 & 0xfff].repr;
            uVar18 = *(ulong *)(alignment + 0x2850);
            do {
              uVar19 = uVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
              LOCK();
              uVar14 = *(ulong *)(alignment + 0x2850);
              bVar27 = uVar18 == uVar14;
              if (bVar27) {
                *(ulong *)(alignment + 0x2850) = uVar19;
                uVar14 = uVar18;
              }
              UNLOCK();
              uVar18 = uVar14;
            } while (bVar27);
            uVar19 = uVar19 >> (-('\f' - bVar24) & 0x3f);
          }
          else {
            uVar19 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state
                     * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
            (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state = uVar19;
            uVar19 = uVar19 >> (bVar24 + 0x34 & 0x3f);
          }
          peVar11->e_addr = (void *)((long)peVar11->e_addr + (uVar19 << (bVar24 & 0x3f)));
        }
        uVar20 = (undefined1)alignment;
        _Var7 = extent_register_impl(tsdn,peVar11,SUB81(uVar17,0));
        if (!_Var7) {
          return peVar11;
        }
        extents_leak(tsdn,arena,ppeVar6,extents,peVar11,(_Bool)uVar20);
      }
    }
    peVar11 = (extent_t *)0x0;
  }
  return peVar11;
}

Assistant:

extent_t *
extent_alloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	extent_t *extent = extent_alloc_retained(tsdn, arena, r_extent_hooks,
	    new_addr, size, pad, alignment, slab, szind, zero, commit);
	if (extent == NULL) {
		if (opt_retain && new_addr != NULL) {
			/*
			 * When retain is enabled and new_addr is set, we do not
			 * attempt extent_alloc_wrapper_hard which does mmap
			 * that is very unlikely to succeed (unless it happens
			 * to be at the end).
			 */
			return NULL;
		}
		extent = extent_alloc_wrapper_hard(tsdn, arena, r_extent_hooks,
		    new_addr, size, pad, alignment, slab, szind, zero, commit);
	}

	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}